

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_data.cpp
# Opt level: O3

bool __thiscall
duckdb::PreparedStatementData::TryGetType
          (PreparedStatementData *this,string *identifier,LogicalType *result)

{
  LogicalTypeId LVar1;
  iterator iVar2;
  BoundParameterData *pBVar3;
  long lVar4;
  BoundParameterData *pBVar5;
  long lVar6;
  
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->value_map)._M_h,identifier);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                       ((shared_ptr<duckdb::BoundParameterData,_true> *)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
                               ._M_cur + 0x28));
    LVar1 = (pBVar3->return_type).id_;
    pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                       ((shared_ptr<duckdb::BoundParameterData,_true> *)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
                               ._M_cur + 0x28));
    if (LVar1 == INVALID) {
      if (pBVar3 == (BoundParameterData *)result) goto LAB_004d966c;
      lVar4 = 8;
      lVar6 = 1;
      pBVar5 = pBVar3;
    }
    else {
      if (&pBVar3->return_type == result) goto LAB_004d966c;
      lVar4 = 0x48;
      lVar6 = 0x41;
      pBVar5 = (BoundParameterData *)&pBVar3->return_type;
    }
    result->id_ = (pBVar5->value).type_.id_;
    result->physical_type_ = (&(pBVar3->value).type_.id_)[lVar6];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&result->type_info_,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(&(pBVar3->value).type_.id_ + lVar4));
  }
LAB_004d966c:
  return iVar2.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool PreparedStatementData::TryGetType(const string &identifier, LogicalType &result) {
	auto it = value_map.find(identifier);
	if (it == value_map.end()) {
		return false;
	}
	if (it->second->return_type.id() != LogicalTypeId::INVALID) {
		result = it->second->return_type;
	} else {
		result = it->second->GetValue().type();
	}
	return true;
}